

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O3

void __thiscall
cali::NodeBuffer::for_each(NodeBuffer *this,function<void_(const_cali::NodeBuffer::NodeInfo_&)> *fn)

{
  uchar *puVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  cali_attr_type type;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  NodeInfo ret;
  
  if ((this->m_count != 0) && (this->m_pos != 0)) {
    uVar4 = 0;
    uVar2 = 0;
    do {
      puVar1 = this->m_buffer;
      bVar3 = 0;
      lVar5 = 0;
      uVar7 = 0;
      do {
        bVar9 = puVar1[lVar5 + uVar2];
        if (-1 < (char)bVar9) goto LAB_00188a9a;
        uVar7 = uVar7 | (ulong)(bVar9 & 0x7f) << (bVar3 & 0x3f);
        lVar5 = lVar5 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar5 != 9);
      bVar9 = puVar1[uVar2 + 9];
      lVar5 = 9;
LAB_00188a9a:
      lVar11 = 0;
      do {
        if (-1 < (char)puVar1[lVar11 + lVar5 + uVar2 + 1]) goto LAB_00188af6;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 9);
      lVar11 = 9;
LAB_00188af6:
      lVar8 = lVar5 + lVar11 + 2;
      if ((((ulong)(bVar9 & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar7) & 1) != 0) {
        lVar6 = 0;
        do {
          if (-1 < (char)puVar1[lVar6 + lVar5 + lVar11 + uVar2 + 2]) goto LAB_00188b64;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 9);
        lVar6 = 9;
LAB_00188b64:
        lVar8 = lVar8 + lVar6 + 1;
      }
      bVar3 = 0;
      lVar5 = 0;
      uVar7 = 0;
      do {
        bVar9 = puVar1[lVar5 + lVar8 + uVar2];
        if (-1 < (char)bVar9) goto LAB_00188bbd;
        uVar7 = uVar7 | (ulong)(bVar9 & 0x7f) << (bVar3 & 0x3f);
        lVar5 = lVar5 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar5 != 9);
      bVar9 = puVar1[lVar8 + uVar2 + 9];
      lVar5 = 9;
LAB_00188bbd:
      lVar6 = lVar8 + lVar5 + 1;
      lVar11 = lVar8 + lVar5 + uVar2;
      bVar3 = 0;
      lVar8 = 0;
      uVar10 = 0;
      do {
        bVar12 = puVar1[lVar8 + lVar11 + 1];
        if (-1 < (char)bVar12) goto LAB_00188c01;
        uVar10 = uVar10 | (ulong)(bVar12 & 0x7f) << (bVar3 & 0x3f);
        lVar8 = lVar8 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar8 != 9);
      bVar12 = puVar1[lVar11 + 10];
      lVar8 = 9;
LAB_00188c01:
      uVar7 = ((ulong)bVar9 & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar7;
      uVar10 = (ulong)(bVar12 & 0x7f) << ((char)lVar8 * '\a' & 0x3fU) | uVar10;
      type = (cali_attr_type)uVar7;
      if (9 < uVar7) {
        type = CALI_TYPE_INV;
      }
      cali_make_variant(type,puVar1 + lVar6 + lVar8 + uVar2 + 1,uVar10);
      if (*(long *)(fn + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(fn + 0x18))();
      uVar4 = uVar4 + 1;
    } while ((uVar4 < this->m_count) &&
            (uVar2 = lVar6 + lVar8 + 1 + uVar2 + uVar10, uVar2 < this->m_pos));
  }
  return;
}

Assistant:

void NodeBuffer::for_each(const std::function<void(const NodeInfo&)> fn) const
{
    size_t pos = 0;

    for (size_t i = 0; i < m_count && pos < m_pos; ++i)
        fn(::unpack_node(m_buffer + pos, &pos));
}